

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_ce.cpp
# Opt level: O0

void msd_CE6(uchar **strings,size_t n)

{
  uint16_t *oracle_00;
  uchar **sorted_00;
  uchar **sorted;
  uint16_t *oracle;
  size_t n_local;
  uchar **strings_local;
  
  oracle_00 = (uint16_t *)malloc(n << 1);
  sorted_00 = (uchar **)malloc(n << 3);
  msd_CE6(strings,n,0,oracle_00,sorted_00);
  free(oracle_00);
  free(sorted_00);
  return;
}

Assistant:

void msd_CE6(unsigned char** strings, size_t n)
{
	uint16_t* restrict oracle = (uint16_t*)
		malloc(n*sizeof(uint16_t));
	unsigned char** sorted = (unsigned char**)
		malloc(n*sizeof(unsigned char*));
	msd_CE6(strings, n, 0, oracle, sorted);
	free(oracle);
	free(sorted);
}